

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  *(undefined ***)(this + -0x18) = &PTR__PostprocFiltersTest_010450d0;
  *(undefined ***)(this + -8) = &PTR__PostprocFiltersTest_01045128;
  *(undefined ***)this = &PTR__PostprocFiltersTest_01045148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this + 1000));
  *(undefined ***)this = &PTR__EncoderTest_0103d9f8;
  if (*(PostprocFiltersTestLarge_MD5Match_Test **)(this + 0x3a8) != this + 0x3b8) {
    operator_delete(*(PostprocFiltersTestLarge_MD5Match_Test **)(this + 0x3a8));
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x18));
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }